

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O3

void SSTable::readDic(string *fileName,SSTableDic *dic)

{
  char *__s;
  size_t sVar1;
  runtime_error *this;
  long *plVar2;
  size_type *psVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int offset;
  vector<int,_std::allocator<int>_> offsets;
  uint64_t length;
  vector<unsigned_long,_std::allocator<unsigned_long>_> keys;
  string value;
  uint64_t key;
  ifstream in;
  int local_2ac;
  void *local_2a8;
  iterator iStack_2a0;
  int *local_298;
  ulong local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  unsigned_long local_248;
  vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>
  *local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_240 = (vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>
               *)dic;
  std::ifstream::ifstream(local_238,(string *)fileName,_S_in|_S_bin);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    std::istream::seekg((long)local_238,8);
    std::istream::read((char *)local_238,(long)&local_290);
    std::istream::seekg((long)local_238,0x2820);
    local_288._M_dataplus._M_p = (pointer)0x0;
    local_288._M_string_length = 0;
    local_288.field_2._M_allocated_capacity = 0;
    local_298 = (int *)0x0;
    local_2a8 = (void *)0x0;
    iStack_2a0._M_current = (int *)0x0;
    if (local_290 != 0) {
      uVar4 = 0;
      do {
        std::istream::read((char *)local_238,(long)&local_248);
        std::istream::read((char *)local_238,(long)&local_2ac);
        if (local_288._M_string_length == local_288.field_2._M_allocated_capacity) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_288,
                     (iterator)local_288._M_string_length,&local_248);
        }
        else {
          *(unsigned_long *)local_288._M_string_length = local_248;
          local_288._M_string_length = local_288._M_string_length + 8;
        }
        if (iStack_2a0._M_current == local_298) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_2a8,iStack_2a0,&local_2ac);
        }
        else {
          *iStack_2a0._M_current = local_2ac;
          iStack_2a0._M_current = iStack_2a0._M_current + 1;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < local_290);
    }
    std::istream::read((char *)local_238,(long)&local_248);
    std::istream::read((char *)local_238,(long)&local_2ac);
    if (iStack_2a0._M_current == local_298) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_2a8,iStack_2a0,&local_2ac);
    }
    else {
      *iStack_2a0._M_current = local_2ac;
      iStack_2a0._M_current = iStack_2a0._M_current + 1;
    }
    if (local_290 != 0) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        lVar6 = (long)*(int *)((long)local_2a8 + uVar4 * 4 + 4) -
                (long)*(int *)((long)local_2a8 + uVar4 * 4);
        __s = (char *)operator_new__(lVar6 + 1);
        std::istream::read((char *)local_238,(long)__s);
        __s[lVar6] = '\0';
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        sVar1 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,__s,__s + sVar1);
        operator_delete__(__s);
        std::
        vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>
        ::emplace_back<unsigned_long&,std::__cxx11::string&>
                  (local_240,(unsigned_long *)(local_288._M_dataplus._M_p + lVar5),&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 8;
      } while (uVar4 < local_290);
    }
    std::ifstream::close();
    if (local_2a8 != (void *)0x0) {
      operator_delete(local_2a8,(long)local_298 - (long)local_2a8);
    }
    if (local_288._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_288._M_dataplus._M_p,
                      local_288.field_2._M_allocated_capacity - (long)local_288._M_dataplus._M_p);
    }
    std::ifstream::~ifstream(local_238);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_288,"readDic: Open file ",fileName);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_288);
  local_268._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_268._M_dataplus._M_p == psVar3) {
    local_268.field_2._M_allocated_capacity = *psVar3;
    local_268.field_2._8_8_ = plVar2[3];
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  }
  else {
    local_268.field_2._M_allocated_capacity = *psVar3;
  }
  local_268._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_268);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SSTable::readDic(const string &fileName, SSTableDic &dic) {
  ifstream in(fileName, ios_base::in | ios_base::binary);
  if (in.fail())
    throw runtime_error("readDic: Open file " + fileName + " failed!");

  uint64_t length;
  in.seekg(8, ifstream::beg);  // skip timeStamp
  read64(in, length);
  in.seekg(10272, ifstream::beg);  // skip header and bloomFilter

  // read keys and offsets
  vector<uint64_t> keys;
  vector<int> offsets;
  uint64_t key;
  int offset;
  for (uint64_t i = 0; i < length; i++) {
    read64(in, key);
    read32(in, offset);
    keys.push_back(key);
    offsets.push_back(offset);
  }
  read64(in, key);
  read32(in, offset);
  offsets.push_back(offset);

  // read values
  for (uint64_t i = 0; i < length; i++) {
    auto valueSize = offsets[i + 1] - offsets[i];
    char *buf = new char[valueSize + 1];
    in.read(buf, valueSize);
    buf[valueSize] = '\0';
    string value(buf);
    delete[] buf;
    dic.emplace_back(keys[i], value);
  }

  in.close();
}